

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorProto::SerializeWithCachedSizes
          (DescriptorProto *this,CodedOutputStream *output)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  Type *pTVar2;
  Type *value;
  Type *value_00;
  Type *value_01;
  int i;
  int iVar3;
  MessageOptions *value_02;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(1,this->name_,output);
  }
  for (iVar3 = 0; iVar3 < (this->field_).super_RepeatedPtrFieldBase.current_size_; iVar3 = iVar3 + 1
      ) {
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->field_).super_RepeatedPtrFieldBase,iVar3);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)pTVar2,output);
  }
  for (iVar3 = 0; iVar3 < (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar3 = iVar3 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                      (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar3);
    internal::WireFormatLite::WriteMessageMaybeToArray(3,(MessageLite *)value,output);
  }
  for (iVar3 = 0; iVar3 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar3 = iVar3 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar3);
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value_00,output);
  }
  for (iVar3 = 0; iVar3 < (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      iVar3 = iVar3 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                         (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar3);
    internal::WireFormatLite::WriteMessageMaybeToArray(5,(MessageLite *)value_01,output);
  }
  for (iVar3 = 0; iVar3 < (this->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar3 = iVar3 + 1) {
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->extension_).super_RepeatedPtrFieldBase,iVar3);
    internal::WireFormatLite::WriteMessageMaybeToArray(6,(MessageLite *)pTVar2,output);
  }
  if ((this->_has_bits_[0] & 0x40) != 0) {
    value_02 = this->options_;
    if (value_02 == (MessageOptions *)0x0) {
      value_02 = *(MessageOptions **)(default_instance_ + 0x90);
    }
    internal::WireFormatLite::WriteMessageMaybeToArray(7,(MessageLite *)value_02,output);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
    return;
  }
  return;
}

Assistant:

void DescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name(), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (int i = 0; i < this->field_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->field(i), output);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (int i = 0; i < this->nested_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, this->nested_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (int i = 0; i < this->enum_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->enum_type(i), output);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (int i = 0; i < this->extension_range_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->extension_range(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (int i = 0; i < this->extension_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->extension(i), output);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (has_options()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, this->options(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}